

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraphTest.cpp
# Opt level: O0

void __thiscall DynamicGraphTest::testNonBreakDelete(DynamicGraphTest *this)

{
  initializer_list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> __l;
  bool bVar1;
  unsigned_long uVar2;
  ostream *this_00;
  DynamicGraph *v;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> local_149;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_148;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_128;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_108;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_e8;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_c8;
  unsigned_long local_b0;
  unsigned_long uStack_a8;
  property_type *local_a0;
  unsigned_long local_98;
  unsigned_long uStack_90;
  property_type *local_88;
  unsigned_long local_80;
  unsigned_long uStack_78;
  property_type *local_70;
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  expectedVirtualEdges;
  Vertex local_38 [5];
  DynamicGraphTest *local_10;
  DynamicGraphTest *this_local;
  
  local_38[4] = 0x10;
  local_38[3] = 0x11;
  local_10 = this;
  bVar1 = DynamicGraph::areConnected(&this->G,local_38 + 4,local_38 + 3);
  if (!bVar1) {
    __assert_fail("G.areConnected(16, 17)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x6e,"void DynamicGraphTest::testNonBreakDelete()");
  }
  local_38[2] = 0x10;
  local_38[1] = 0x11;
  DynamicGraph::deleteEdge(&this->G,local_38 + 2,local_38 + 1);
  local_38[0] = 0x10;
  expectedVirtualEdges.
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = 0x11;
  bVar1 = DynamicGraph::areConnected
                    (&this->G,local_38,
                     &expectedVirtualEdges.
                      super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                      ._M_impl._M_node._M_size);
  if (!bVar1) {
    __assert_fail("G.areConnected(16, 17)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x71,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0);
  if (uVar2 != 0) {
    __assert_fail("G.getLevel(0)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x74,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,1);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(1)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x75,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,2);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(2)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x76,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,3);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(3)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x77,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,4);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(4)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x78,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,5);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(5)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x79,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,6);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(6)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7a,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,7);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(7)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7b,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,8);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(8)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7c,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,9);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(9)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7d,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,10);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(10)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7e,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0xb);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(11)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7f,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0xc);
  if (uVar2 != 3) {
    __assert_fail("G.getLevel(12)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x80,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0xd);
  if (uVar2 != 3) {
    __assert_fail("G.getLevel(13)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x81,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0xe);
  if (uVar2 != 4) {
    __assert_fail("G.getLevel(14)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x82,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0xf);
  if (uVar2 != 3) {
    __assert_fail("G.getLevel(15)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x83,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0x10);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(16)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x84,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0x11);
  if (uVar2 != 4) {
    __assert_fail("G.getLevel(17)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x85,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0x12);
  if (uVar2 != 3) {
    __assert_fail("G.getLevel(18)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x86,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getLevel(&this->G,0x13);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(19)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x87,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,0);
  if (uVar2 != 1) {
    __assert_fail("G.getComponent(0)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8a,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,1);
  if (uVar2 != 1) {
    __assert_fail("G.getComponent(1)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8b,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,2);
  if (uVar2 != 1) {
    __assert_fail("G.getComponent(2)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8c,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,3);
  if (uVar2 != 1) {
    __assert_fail("G.getComponent(3)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8d,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,4);
  if (uVar2 != 2) {
    __assert_fail("G.getComponent(4)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8e,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,5);
  if (uVar2 != 2) {
    __assert_fail("G.getComponent(5)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8f,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,6);
  if (uVar2 != 2) {
    __assert_fail("G.getComponent(6)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x90,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,9);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(9)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x91,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,10);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(10)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x92,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar2 = DynamicGraph::getComponent(&this->G,0xb);
  if (uVar2 == 4) {
    uVar2 = DynamicGraph::getComponent(&this->G,0xc);
    if (uVar2 != 4) {
      __assert_fail("G.getComponent(12)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x94,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar2 = DynamicGraph::getComponent(&this->G,0xd);
    if (uVar2 != 4) {
      __assert_fail("G.getComponent(13)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x95,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar2 = DynamicGraph::getComponent(&this->G,0xe);
    if (uVar2 != 4) {
      __assert_fail("G.getComponent(14)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x96,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar2 = DynamicGraph::getComponent(&this->G,0xf);
    if (uVar2 != 4) {
      __assert_fail("G.getComponent(15)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x97,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar2 = DynamicGraph::getComponent(&this->G,0x10);
    if (uVar2 != 5) {
      __assert_fail("G.getComponent(16)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x98,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar2 = DynamicGraph::getComponent(&this->G,0x11);
    if (uVar2 != 5) {
      __assert_fail("G.getComponent(17)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x99,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar2 = DynamicGraph::getComponent(&this->G,0x12);
    if (uVar2 != 5) {
      __assert_fail("G.getComponent(18)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x9a,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar2 = DynamicGraph::getComponent(&this->G,0x13);
    if (uVar2 == 5) {
      v = &this->G;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_e8,(boost *)0x0,4,(vertex_descriptor)v,in_R8);
      local_c8.m_eproperty = local_e8.first.m_eproperty;
      local_c8.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           local_e8.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      local_c8.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           local_e8.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_108,(boost *)0x0,7,(vertex_descriptor)v,in_R8);
      local_a0 = local_108.first.m_eproperty;
      local_b0 = local_108.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      uStack_a8 = local_108.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_128,(boost *)0x0,9,(vertex_descriptor)v,in_R8);
      local_88 = local_128.first.m_eproperty;
      local_98 = local_128.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      uStack_90 = local_128.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_148,(boost *)0x0,0x10,(vertex_descriptor)v,in_R8);
      local_70 = local_148.first.m_eproperty;
      local_80 = local_148.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      uStack_78 = local_148.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      local_68 = &local_c8;
      local_60 = 4;
      std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
      allocator(&local_149);
      __l._M_len = local_60;
      __l._M_array = local_68;
      std::__cxx11::
      list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::list((list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              *)local_58,__l,&local_149);
      std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
      ~allocator(&local_149);
      testVirtualEdges(this,(list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                             *)local_58);
      this_00 = std::operator<<((ostream *)&std::cout,"[+] test non break delete OK!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::
      list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::~list((list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
               *)local_58);
      return;
    }
    __assert_fail("G.getComponent(19)==5",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x9b,"void DynamicGraphTest::testNonBreakDelete()");
  }
  __assert_fail("G.getComponent(11)==4",
                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                ,0x93,"void DynamicGraphTest::testNonBreakDelete()");
}

Assistant:

void DynamicGraphTest::testNonBreakDelete()
{
    assert(G.areConnected(16, 17));

    G.deleteEdge(16, 17);
    assert(G.areConnected(16, 17));

    // test levels
    assert(G.getLevel(0)==0);
    assert(G.getLevel(1)==1);
    assert(G.getLevel(2)==1);
    assert(G.getLevel(3)==2);
    assert(G.getLevel(4)==1);
    assert(G.getLevel(5)==2);
    assert(G.getLevel(6)==2);
    assert(G.getLevel(7)==1);
    assert(G.getLevel(8)==2);
    assert(G.getLevel(9)==1);
    assert(G.getLevel(10)==2);
    assert(G.getLevel(11)==2);
    assert(G.getLevel(12)==3);
    assert(G.getLevel(13)==3);
    assert(G.getLevel(14)==4);
    assert(G.getLevel(15)==3);
    assert(G.getLevel(16)==1);
    assert(G.getLevel(17)==4);
    assert(G.getLevel(18)==3);
    assert(G.getLevel(19)==2);

    // test components nothing changes
    assert(G.getComponent(0)==1);
    assert(G.getComponent(1)==1);
    assert(G.getComponent(2)==1);
    assert(G.getComponent(3)==1);
    assert(G.getComponent(4)==2);
    assert(G.getComponent(5)==2);
    assert(G.getComponent(6)==2);
    assert(G.getComponent(9)==4);
    assert(G.getComponent(10)==4);
    assert(G.getComponent(11)==4);
    assert(G.getComponent(12)==4);
    assert(G.getComponent(13)==4);
    assert(G.getComponent(14)==4);
    assert(G.getComponent(15)==4);
    assert(G.getComponent(16)==5);
    assert(G.getComponent(17)==5);
    assert(G.getComponent(18)==5);
    assert(G.getComponent(19)==5);

    // test virtual edges
    std::list<Edge> expectedVirtualEdges = {
            edge(0, 4, G).first,
            edge(0, 7, G).first,
            edge(0, 9, G).first,
            edge(0, 16, G).first,
    };
    testVirtualEdges(expectedVirtualEdges);


    std::cout << "[+] test non break delete OK!" << std::endl;
}